

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec_utils.c
# Opt level: O2

int hash_byte_sequence(uint8_t *bytes,size_t bytes_len,uint8_t alg_suite_id,uchar **hash_result)

{
  long lVar1;
  int iVar2;
  uchar *puVar3;
  undefined7 in_register_00000011;
  long in_FS_OFFSET;
  SHA256_CTX ctx;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)CONCAT71(in_register_00000011,alg_suite_id) == 1) {
    puVar3 = (uchar *)lrtr_malloc(0x20);
    *hash_result = puVar3;
    if (puVar3 == (uchar *)0x0) {
      iVar2 = -1;
    }
    else {
      SHA256_Init((SHA256_CTX *)&ctx);
      SHA256_Update((SHA256_CTX *)&ctx,bytes,bytes_len);
      SHA256_Final(*hash_result,(SHA256_CTX *)&ctx);
      iVar2 = -(uint)(*hash_result == (uchar *)0x0);
    }
  }
  else {
    iVar2 = -6;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

int hash_byte_sequence(uint8_t *bytes, size_t bytes_len, uint8_t alg_suite_id, unsigned char **hash_result)
{
	if (alg_suite_id == RTR_BGPSEC_ALGORITHM_SUITE_1) {
		SHA256_CTX ctx;

		*hash_result = lrtr_malloc(SHA256_DIGEST_LENGTH);
		if (!*hash_result)
			return RTR_BGPSEC_ERROR;

		SHA256_Init(&ctx);
		SHA256_Update(&ctx, (const unsigned char *)bytes, bytes_len);
		SHA256_Final(*hash_result, &ctx);

		if (!*hash_result)
			return RTR_BGPSEC_ERROR;
	} else {
		return RTR_BGPSEC_UNSUPPORTED_ALGORITHM_SUITE;
	}

	return RTR_BGPSEC_SUCCESS;
}